

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::matrix2d> *value)

{
  bool bVar1;
  matrix2d v;
  matrix2d local_38;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    value->has_value_ = false;
    bVar1 = true;
  }
  else {
    local_38.m[0][0] = 1.0;
    local_38.m[0][1] = 0.0;
    local_38.m[1][0] = 0.0;
    local_38.m[1][1] = 1.0;
    bVar1 = ParseMatrix(this,&local_38);
    if (bVar1) {
      nonstd::optional_lite::optional<tinyusdz::value::matrix2d>::operator=(value,&local_38);
    }
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::matrix2d> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::matrix2d v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}